

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O1

void __thiscall btMLCPSolver::createMLCP(btMLCPSolver *this,btContactSolverInfo *infoGlobal)

{
  uint uVar1;
  uint rows;
  int iVar2;
  btSolverConstraint **ppbVar3;
  float *pfVar4;
  float *pfVar5;
  btSolverConstraint *pbVar6;
  btSolverBody *pbVar7;
  btRigidBody *pbVar8;
  float *pfVar9;
  int r;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 *puVar17;
  float *pfVar18;
  int c;
  long lVar19;
  float fVar20;
  btMatrixXf local_88;
  
  uVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_size;
  rows = (this->m_allConstraintPtrArray).m_size;
  btVectorX<float>::resize(&this->m_b,rows);
  if ((infoGlobal->super_btContactSolverInfoData).m_splitImpulse != 0) {
    btVectorX<float>::resize(&this->m_bSplit,rows);
  }
  lVar11 = (long)(this->m_bSplit).m_storage.m_size;
  if (lVar11 != 0) {
    memset((this->m_bSplit).m_storage.m_data,0,lVar11 << 2);
  }
  lVar11 = (long)(this->m_b).m_storage.m_size;
  if (lVar11 != 0) {
    memset((this->m_b).m_storage.m_data,0,lVar11 << 2);
  }
  if (0 < (int)rows) {
    ppbVar3 = (this->m_allConstraintPtrArray).m_data;
    pfVar4 = (this->m_b).m_storage.m_data;
    pfVar5 = (this->m_bSplit).m_storage.m_data;
    iVar2 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse;
    uVar13 = 0;
    do {
      pbVar6 = ppbVar3[uVar13];
      fVar20 = pbVar6->m_jacDiagABInv;
      if (((fVar20 != 0.0) || (NAN(fVar20))) &&
         (pfVar4[uVar13] = pbVar6->m_rhs / fVar20, iVar2 != 0)) {
        pfVar5[uVar13] = pbVar6->m_rhsPenetration / pbVar6->m_jacDiagABInv;
      }
      uVar13 = uVar13 + 1;
    } while (rows != uVar13);
  }
  if (createMLCP(btContactSolverInfo_const&)::Minv == '\0') {
    createMLCP();
  }
  iVar2 = uVar1 * 6;
  btMatrixX<float>::resize(&createMLCP::Minv,iVar2,iVar2);
  btMatrixX<float>::setZero(&createMLCP::Minv);
  pfVar4 = createMLCP::Minv.m_storage.m_data;
  iVar10 = createMLCP::Minv.m_cols;
  if (0 < (int)uVar1) {
    pbVar7 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data;
    iVar14 = createMLCP::Minv.m_cols + 1;
    iVar12 = createMLCP::Minv.m_cols * 3 + 3;
    iVar16 = createMLCP::Minv.m_cols * 6;
    uVar13 = 0;
    do {
      iVar15 = (int)uVar13;
      pfVar4[iVar15 * 6 * iVar14] = pbVar7[uVar13].m_invMass.m_floats[0];
      pfVar4[(iVar15 * 6 + 1) * iVar14] = pbVar7[uVar13].m_invMass.m_floats[1];
      pfVar4[(iVar15 * 6 + 2) * iVar14] = pbVar7[uVar13].m_invMass.m_floats[2];
      pbVar8 = pbVar7[uVar13].m_originalBody;
      puVar17 = &(pbVar8->super_btCollisionObject).field_0x14c;
      lVar11 = 0;
      iVar15 = iVar12;
      do {
        lVar19 = 0;
        do {
          if (pbVar8 == (btRigidBody *)0x0) {
            fVar20 = 0.0;
          }
          else {
            fVar20 = *(float *)(puVar17 + lVar19 * 4);
          }
          pfVar4[iVar15 + (int)lVar19] = fVar20;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        lVar11 = lVar11 + 1;
        puVar17 = puVar17 + 0x10;
        iVar15 = iVar15 + iVar10;
      } while (lVar11 != 3);
      uVar13 = uVar13 + 1;
      iVar12 = iVar12 + iVar16 + 6;
    } while (uVar13 != uVar1);
    createMLCP::Minv.m_setElemOperations = createMLCP::Minv.m_setElemOperations + uVar1 * 0xc;
  }
  if (createMLCP(btContactSolverInfo_const&)::J == '\0') {
    createMLCP();
  }
  btMatrixX<float>::resize(&createMLCP::J,rows,iVar2);
  btMatrixX<float>::setZero(&createMLCP::J);
  btVectorX<float>::resize(&this->m_lo,rows);
  btVectorX<float>::resize(&this->m_hi,rows);
  pfVar4 = createMLCP::J.m_storage.m_data;
  iVar2 = createMLCP::J.m_cols;
  if (0 < (int)rows) {
    ppbVar3 = (this->m_allConstraintPtrArray).m_data;
    pbVar7 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data;
    pfVar5 = (this->m_lo).m_storage.m_data;
    pfVar9 = (this->m_hi).m_storage.m_data;
    lVar11 = (long)createMLCP::J.m_cols;
    iVar16 = 5;
    uVar13 = 0;
    pfVar18 = createMLCP::J.m_storage.m_data;
    iVar10 = createMLCP::J.m_setElemOperations;
    do {
      pbVar6 = ppbVar3[uVar13];
      pfVar5[uVar13] = pbVar6->m_lowerLimit;
      pfVar9[uVar13] = pbVar6->m_upperLimit;
      iVar12 = pbVar6->m_solverBodyIdA;
      iVar14 = pbVar6->m_solverBodyIdB;
      if (pbVar7[iVar12].m_originalBody != (btRigidBody *)0x0) {
        iVar15 = iVar12 * 6;
        pfVar18[(long)iVar12 * 6] = (pbVar6->m_contactNormal1).m_floats[0];
        pfVar4[iVar16 + -4 + iVar15] = (pbVar6->m_contactNormal1).m_floats[1];
        pfVar4[iVar16 + -3 + iVar15] = (pbVar6->m_contactNormal1).m_floats[2];
        pfVar4[iVar16 + -2 + iVar15] = (pbVar6->m_relpos1CrossNormal).m_floats[0];
        pfVar4[iVar16 + -1 + iVar15] = (pbVar6->m_relpos1CrossNormal).m_floats[1];
        iVar10 = iVar10 + 6;
        createMLCP::J.m_setElemOperations = iVar10;
        pfVar4[iVar16 + iVar15] = (pbVar6->m_relpos1CrossNormal).m_floats[2];
      }
      if (pbVar7[iVar14].m_originalBody != (btRigidBody *)0x0) {
        iVar14 = iVar14 * 6;
        pfVar18[iVar14] = (pbVar6->m_contactNormal2).m_floats[0];
        pfVar4[iVar16 + -4 + iVar14] = (pbVar6->m_contactNormal2).m_floats[1];
        pfVar4[iVar16 + -3 + iVar14] = (pbVar6->m_contactNormal2).m_floats[2];
        pfVar4[iVar16 + -2 + iVar14] = (pbVar6->m_relpos2CrossNormal).m_floats[0];
        pfVar4[iVar16 + -1 + iVar14] = (pbVar6->m_relpos2CrossNormal).m_floats[1];
        iVar10 = iVar10 + 6;
        createMLCP::J.m_setElemOperations = iVar10;
        pfVar4[iVar16 + iVar14] = (pbVar6->m_relpos2CrossNormal).m_floats[2];
      }
      uVar13 = uVar13 + 1;
      pfVar18 = pfVar18 + lVar11;
      iVar16 = iVar16 + iVar2;
    } while (rows != uVar13);
  }
  if (createMLCP(btContactSolverInfo_const&)::J_transpose == '\0') {
    createMLCP();
  }
  btMatrixX<float>::transpose(&local_88,&createMLCP::J);
  createMLCP::J_transpose.m_setElemOperations = local_88.m_setElemOperations;
  createMLCP::J_transpose.m_rows = local_88.m_rows;
  createMLCP::J_transpose.m_cols = local_88.m_cols;
  createMLCP::J_transpose.m_operations = local_88.m_operations;
  createMLCP::J_transpose.m_resizeOperations = local_88.m_resizeOperations;
  btAlignedObjectArray<float>::copyFromArray(&createMLCP::J_transpose.m_storage,&local_88.m_storage)
  ;
  btAlignedObjectArray<btAlignedObjectArray<int>_>::copyFromArray
            (&createMLCP::J_transpose.m_rowNonZeroElements1,&local_88.m_rowNonZeroElements1);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::~btAlignedObjectArray
            (&local_88.m_rowNonZeroElements1);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_88.m_storage);
  if (createMLCP(btContactSolverInfo_const&)::tmp == '\0') {
    createMLCP();
  }
  CProfileManager::Start_Profile("J*Minv");
  btMatrixX<float>::operator*(&local_88,&createMLCP::J,&createMLCP::Minv);
  createMLCP::tmp.m_setElemOperations = local_88.m_setElemOperations;
  createMLCP::tmp.m_rows = local_88.m_rows;
  createMLCP::tmp.m_cols = local_88.m_cols;
  createMLCP::tmp.m_operations = local_88.m_operations;
  createMLCP::tmp.m_resizeOperations = local_88.m_resizeOperations;
  btAlignedObjectArray<float>::copyFromArray(&createMLCP::tmp.m_storage,&local_88.m_storage);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::copyFromArray
            (&createMLCP::tmp.m_rowNonZeroElements1,&local_88.m_rowNonZeroElements1);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::~btAlignedObjectArray
            (&local_88.m_rowNonZeroElements1);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_88.m_storage);
  CProfileManager::Stop_Profile();
  CProfileManager::Start_Profile("J*tmp");
  btMatrixX<float>::operator*(&local_88,&createMLCP::tmp,&createMLCP::J_transpose);
  (this->m_A).m_setElemOperations = local_88.m_setElemOperations;
  (this->m_A).m_rows = local_88.m_rows;
  (this->m_A).m_cols = local_88.m_cols;
  (this->m_A).m_operations = local_88.m_operations;
  (this->m_A).m_resizeOperations = local_88.m_resizeOperations;
  btAlignedObjectArray<float>::copyFromArray(&(this->m_A).m_storage,&local_88.m_storage);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::copyFromArray
            (&(this->m_A).m_rowNonZeroElements1,&local_88.m_rowNonZeroElements1);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::~btAlignedObjectArray
            (&local_88.m_rowNonZeroElements1);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_88.m_storage);
  CProfileManager::Stop_Profile();
  iVar2 = (this->m_A).m_rows;
  lVar11 = (long)iVar2;
  if (0 < lVar11) {
    iVar10 = (this->m_A).m_cols;
    iVar16 = (this->m_A).m_setElemOperations;
    pfVar4 = (this->m_A).m_storage.m_data;
    iVar12 = 0;
    do {
      pfVar4[iVar12] =
           this->m_cfm / (infoGlobal->super_btContactSolverInfoData).m_timeStep + pfVar4[iVar12];
      iVar12 = iVar12 + iVar10 + 1;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    (this->m_A).m_setElemOperations = iVar2 + iVar16;
  }
  btVectorX<float>::resize(&this->m_x,rows);
  if ((infoGlobal->super_btContactSolverInfoData).m_splitImpulse != 0) {
    btVectorX<float>::resize(&this->m_xSplit,rows);
  }
  lVar11 = (long)(this->m_allConstraintPtrArray).m_size;
  if (0 < lVar11) {
    ppbVar3 = (this->m_allConstraintPtrArray).m_data;
    pfVar4 = (this->m_x).m_storage.m_data;
    pfVar5 = (this->m_xSplit).m_storage.m_data;
    iVar2 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse;
    lVar19 = 0;
    do {
      pbVar6 = ppbVar3[lVar19];
      pfVar4[lVar19] = pbVar6->m_appliedImpulse;
      if (iVar2 != 0) {
        pfVar5[lVar19] = pbVar6->m_appliedPushImpulse;
      }
      lVar19 = lVar19 + 1;
    } while (lVar11 != lVar19);
  }
  return;
}

Assistant:

void btMLCPSolver::createMLCP(const btContactSolverInfo& infoGlobal)
{
	int numBodies = this->m_tmpSolverBodyPool.size();
	int numConstraintRows = m_allConstraintPtrArray.size();

	m_b.resize(numConstraintRows);
	if (infoGlobal.m_splitImpulse)
		m_bSplit.resize(numConstraintRows);
 
	m_bSplit.setZero();
	m_b.setZero();

	for (int i=0;i<numConstraintRows ;i++)
	{
		if (m_allConstraintPtrArray[i]->m_jacDiagABInv)
		{
			m_b[i]=m_allConstraintPtrArray[i]->m_rhs/m_allConstraintPtrArray[i]->m_jacDiagABInv;
			if (infoGlobal.m_splitImpulse)
				m_bSplit[i] = m_allConstraintPtrArray[i]->m_rhsPenetration/m_allConstraintPtrArray[i]->m_jacDiagABInv;
		}
	}
 
	static btMatrixXu Minv;
	Minv.resize(6*numBodies,6*numBodies);
	Minv.setZero();
	for (int i=0;i<numBodies;i++)
	{
		const btSolverBody& rb = m_tmpSolverBodyPool[i];
		const btVector3& invMass = rb.m_invMass;
		setElem(Minv,i*6+0,i*6+0,invMass[0]);
		setElem(Minv,i*6+1,i*6+1,invMass[1]);
		setElem(Minv,i*6+2,i*6+2,invMass[2]);
		btRigidBody* orgBody = m_tmpSolverBodyPool[i].m_originalBody;
 
		for (int r=0;r<3;r++)
			for (int c=0;c<3;c++)
				setElem(Minv,i*6+3+r,i*6+3+c,orgBody? orgBody->getInvInertiaTensorWorld()[r][c] : 0);
	}
 
	static btMatrixXu J;
	J.resize(numConstraintRows,6*numBodies);
	J.setZero();
 
	m_lo.resize(numConstraintRows);
	m_hi.resize(numConstraintRows);
 
	for (int i=0;i<numConstraintRows;i++)
	{

		m_lo[i] = m_allConstraintPtrArray[i]->m_lowerLimit;
		m_hi[i] = m_allConstraintPtrArray[i]->m_upperLimit;
 
		int bodyIndex0 = m_allConstraintPtrArray[i]->m_solverBodyIdA;
		int bodyIndex1 = m_allConstraintPtrArray[i]->m_solverBodyIdB;
		if (m_tmpSolverBodyPool[bodyIndex0].m_originalBody)
		{
			setElem(J,i,6*bodyIndex0+0,m_allConstraintPtrArray[i]->m_contactNormal1[0]);
			setElem(J,i,6*bodyIndex0+1,m_allConstraintPtrArray[i]->m_contactNormal1[1]);
			setElem(J,i,6*bodyIndex0+2,m_allConstraintPtrArray[i]->m_contactNormal1[2]);
			setElem(J,i,6*bodyIndex0+3,m_allConstraintPtrArray[i]->m_relpos1CrossNormal[0]);
			setElem(J,i,6*bodyIndex0+4,m_allConstraintPtrArray[i]->m_relpos1CrossNormal[1]);
			setElem(J,i,6*bodyIndex0+5,m_allConstraintPtrArray[i]->m_relpos1CrossNormal[2]);
		}
		if (m_tmpSolverBodyPool[bodyIndex1].m_originalBody)
		{
			setElem(J,i,6*bodyIndex1+0,m_allConstraintPtrArray[i]->m_contactNormal2[0]);
			setElem(J,i,6*bodyIndex1+1,m_allConstraintPtrArray[i]->m_contactNormal2[1]);
			setElem(J,i,6*bodyIndex1+2,m_allConstraintPtrArray[i]->m_contactNormal2[2]);
			setElem(J,i,6*bodyIndex1+3,m_allConstraintPtrArray[i]->m_relpos2CrossNormal[0]);
			setElem(J,i,6*bodyIndex1+4,m_allConstraintPtrArray[i]->m_relpos2CrossNormal[1]);
			setElem(J,i,6*bodyIndex1+5,m_allConstraintPtrArray[i]->m_relpos2CrossNormal[2]);
		}
	}
 
	static btMatrixXu J_transpose;
	J_transpose= J.transpose();

	static btMatrixXu tmp;

	{
		{
			BT_PROFILE("J*Minv");
			tmp = J*Minv;

		}
		{
			BT_PROFILE("J*tmp");
			m_A = tmp*J_transpose;
		}
	}

	if (1)
	{
		// add cfm to the diagonal of m_A
		for ( int i=0; i<m_A.rows(); ++i) 
		{
			m_A.setElem(i,i,m_A(i,i)+ m_cfm / infoGlobal.m_timeStep);
		}
	}

	m_x.resize(numConstraintRows);
	if (infoGlobal.m_splitImpulse)
		m_xSplit.resize(numConstraintRows);
//	m_x.setZero();

	for (int i=0;i<m_allConstraintPtrArray.size();i++)
	{
		const btSolverConstraint& c = *m_allConstraintPtrArray[i];
		m_x[i]=c.m_appliedImpulse;
		if (infoGlobal.m_splitImpulse)
			m_xSplit[i] = c.m_appliedPushImpulse;
	}

}